

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.hpp
# Opt level: O3

bool __thiscall tl::StrT<char32_t>::operator!=(StrT<char32_t> *this,CStrT<char32_t> o)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = true;
  uVar1 = o._size;
  if (this->_size == uVar1) {
    if (uVar1 == 0) {
      return false;
    }
    lVar2 = 0;
    do {
      bVar3 = o._str[lVar2] != this->_str[lVar2];
      if (bVar3) {
        return bVar3;
      }
      bVar4 = (ulong)uVar1 - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

bool operator!=(CStrT<CharT> o)const { return !(*this == o); }